

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O2

void __thiscall
server::collectservmode::droptokens(collectservmode *this,clientinfo *ci,bool penalty)

{
  bool bVar1;
  int team;
  int iVar2;
  uint uVar3;
  token *ptVar4;
  ENetPacket *packet;
  token *ptVar5;
  int iVar6;
  uint i;
  int iVar7;
  int iVar8;
  int local_a0;
  int local_9c;
  packetbuf p;
  token local_50;
  
  if (this->notgotbases != false) {
    return;
  }
  iVar2 = strcmp(ci->team,"good");
  if (iVar2 == 0) {
    local_9c = 1;
  }
  else {
    iVar2 = strcmp(ci->team,"evil");
    local_9c = (uint)(iVar2 == 0) * 2;
  }
  local_a0 = 0;
  iVar2 = 0;
  if (!penalty) {
    iVar2 = (ci->state).tokens;
  }
  iVar8 = 1;
  packetbuf::packetbuf(&p,300,1);
  i = (this->tokens).ulen;
  do {
    ptVar4 = (this->tokens).buf;
    do {
      while( true ) {
        do {
          if ((int)i < 1) {
            if (local_a0 != 0) {
              putint(&p,-1);
            }
            putint(&p,0x6e);
            putint(&p,ci->clientnum);
            putint(&p,(int)((ci->state).o.field_0.field_0.x * 16.0));
            putint(&p,(int)((ci->state).o.field_0.field_0.y * 16.0));
            putint(&p,(int)((ci->state).o.field_0.field_0.z * 16.0));
            if (penalty) {
              iVar2 = 1;
            }
            else {
              iVar2 = (ci->state).tokens + 1;
            }
            uVar3 = randomMT();
            iVar7 = 0;
            iVar8 = 0;
            if (0 < iVar2) {
              iVar8 = iVar2;
            }
            for (iVar6 = 0; iVar8 != iVar6; iVar6 = iVar6 + 1) {
              team = -local_9c;
              if (iVar6 == 0) {
                team = local_9c;
              }
              ptVar4 = droptoken(this,&(ci->state).o,iVar7 / iVar2 + (uVar3 & 0xffffff) % 0x168,team
                                 ,lastmillis,ci->clientnum);
              putint(&p,ptVar4->id);
              putint(&p,ptVar4->team);
              putint(&p,ptVar4->yaw);
              iVar7 = iVar7 + 0x168;
            }
            putint(&p,-1);
            packet = packetbuf::finalize(&p);
            sendpacket(-1,1,packet,-1);
            (ci->state).tokens = 0;
            packetbuf::~packetbuf(&p);
            return;
          }
          i = i - 1;
        } while (ptVar4[i].dropper != ci->clientnum);
        ptVar5 = ptVar4 + i;
        if (ptVar5->team == local_9c) break;
        iVar7 = iVar2 + 1;
        bVar1 = 4 < iVar2;
        iVar2 = iVar7;
        if (bVar1) goto LAB_0014668b;
      }
      iVar7 = iVar8 + 1;
      bVar1 = iVar8 < 5;
      iVar8 = iVar7;
    } while (bVar1);
LAB_0014668b:
    if (local_a0 == 0) {
      putint(&p,0x6d);
    }
    putint(&p,ptVar5->id);
    local_a0 = local_a0 + 1;
    vector<server::collectservmode::token>::removeunordered(&local_50,&this->tokens,i);
  } while( true );
}

Assistant:

void droptokens(clientinfo *ci, bool penalty = false)
    {
        if(notgotbases) return;
        int team = collectteambase(ci->team), totalenemy = penalty ? 0 : ci->state.tokens, totalfriendly = 1, expired = 0;
        packetbuf p(300, ENET_PACKET_FLAG_RELIABLE);
        loopvrev(tokens)
        {
            token &t = tokens[i];
            if(t.dropper == ci->clientnum && (t.team == team ? ++totalfriendly > TOKENLIMIT : ++totalenemy > TOKENLIMIT))
            {
                if(!expired) putint(p, N_EXPIRETOKENS);
                expired++;
                putint(p, t.id);
                tokens.removeunordered(i);        
            }
        }
        if(expired) putint(p, -1);
        putint(p, N_DROPTOKENS);
        putint(p, ci->clientnum);
        putint(p, int(ci->state.o.x*DMF));
        putint(p, int(ci->state.o.y*DMF));
        putint(p, int(ci->state.o.z*DMF));
        int numdrops = 1 + (penalty ? 0 : ci->state.tokens), yaw = rnd(360);
        loopi(numdrops)
        {
            token &t = droptoken(ci->state.o, yaw + (i*360)/numdrops, !i ? team : -team, lastmillis, ci->clientnum); 
            putint(p, t.id);
            putint(p, t.team);
            putint(p, t.yaw);
        }
        putint(p, -1);
        sendpacket(-1, 1, p.finalize());
        ci->state.tokens = 0;
    }